

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O3

Abc_Ntk_t * Mop_ManTest(char *pFileName,int fMerge,int fVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Wrd_t *pVVar5;
  Mop_Man_t *p;
  Abc_Ntk_t *pAVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  
  p = Mop_ManRead(pFileName);
  if (p == (Mop_Man_t *)0x0) {
    pAVar6 = (Abc_Ntk_t *)0x0;
  }
  else {
    pVVar3 = p->vCubes;
    iVar7 = pVVar3->nSize;
    if (iVar7 < 1) {
      uVar8 = 0;
    }
    else {
      piVar4 = pVVar3->pArray;
      pVVar5 = p->vWordsOut;
      uVar1 = p->nWordsOut;
      lVar9 = 0;
      uVar8 = 0;
      do {
        iVar2 = piVar4[lVar9];
        uVar10 = uVar1 * iVar2;
        if (((int)uVar10 < 0) || (pVVar5->nSize <= (int)uVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        if (0 < (int)uVar1) {
          uVar11 = 0;
          do {
            if (pVVar5->pArray[uVar10 + uVar11] != 0) {
              if (((int)uVar8 < 0) || (iVar7 <= (int)uVar8)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              uVar11 = (ulong)uVar8;
              uVar8 = uVar8 + 1;
              piVar4[uVar11] = iVar2;
              iVar7 = pVVar3->nSize;
              break;
            }
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar7);
    }
    if (iVar7 < (int)uVar8) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    pVVar3->nSize = uVar8;
    if (fMerge == 0) {
      Mop_ManReduce(p);
    }
    else {
      Mop_ManReduce2(p);
    }
    pAVar6 = Mop_ManDerive(p,pFileName);
    Mop_ManStop(p);
  }
  return pAVar6;
}

Assistant:

Abc_Ntk_t * Mop_ManTest( char * pFileName, int fMerge, int fVerbose )
{
    Abc_Ntk_t * pNtk = NULL;
    Mop_Man_t * p = Mop_ManRead( pFileName );
    if ( p == NULL )
        return NULL;
    Mop_ManRemoveEmpty( p );
    //Mop_ManPrint( p );
    if ( fMerge )
        Mop_ManReduce2( p );
    else
        Mop_ManReduce( p );
    //Mop_ManPrint( p );
    pNtk = Mop_ManDerive( p, pFileName );
    Mop_ManStop( p );
    return pNtk;
}